

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O0

void __thiscall Fl_Text_Editor_Type::ideal_size(Fl_Text_Editor_Type *this,int *w,int *h)

{
  Fl_Text_Display *this_00;
  Fl_Font face;
  Fl_Fontsize fsize;
  Fl_Boxtype FVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  int ww;
  Fl_Text_Editor *myo;
  int *h_local;
  int *w_local;
  Fl_Text_Editor_Type *this_local;
  
  this_00 = (Fl_Text_Display *)(this->super_Fl_Widget_Type).o;
  face = Fl_Text_Display::textfont(this_00);
  fsize = Fl_Text_Display::textsize(this_00);
  fl_font(face,fsize);
  FVar1 = Fl_Widget::box((this->super_Fl_Widget_Type).o);
  iVar2 = Fl::box_dh(FVar1);
  *h = *h - iVar2;
  FVar1 = Fl_Widget::box((this->super_Fl_Widget_Type).o);
  iVar2 = Fl::box_dw(FVar1);
  *w = *w - iVar2;
  dVar7 = fl_width(0x6d);
  iVar3 = (int)dVar7;
  iVar2 = *w;
  FVar1 = Fl_Widget::box((this->super_Fl_Widget_Type).o);
  iVar4 = Fl::box_dw(FVar1);
  *w = ((iVar2 + iVar3 + -1) / iVar3) * iVar3 + iVar4;
  iVar2 = *h;
  iVar3 = fl_height();
  iVar4 = fl_height();
  iVar5 = fl_height();
  FVar1 = Fl_Widget::box((this->super_Fl_Widget_Type).o);
  iVar6 = Fl::box_dh(FVar1);
  *h = ((iVar2 + iVar3 + -1) / iVar4) * iVar5 + iVar6;
  if (*h < 0x1e) {
    *h = 0x1e;
  }
  if (*w < 0x32) {
    *w = 0x32;
  }
  return;
}

Assistant:

virtual void ideal_size(int &w, int &h) {
    Fl_Text_Editor *myo = (Fl_Text_Editor *)o;
    fl_font(myo->textfont(), myo->textsize());
    h -= Fl::box_dh(o->box());
    w -= Fl::box_dw(o->box());
    int ww = (int)fl_width('m');
    w = ((w + ww - 1) / ww) * ww + Fl::box_dw(o->box());
    h = ((h + fl_height() - 1) / fl_height()) * fl_height() +
        Fl::box_dh(o->box());
    if (h < 30) h = 30;
    if (w < 50) w = 50;
  }